

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  string_view_t view;
  string_view_t view_00;
  string_view_t view_01;
  string_view_t view_02;
  bool bVar1;
  __enable_if_is_duration<std::chrono::duration<long>_> this_00;
  size_t sVar2;
  buffer<char> *this_01;
  duration<long,_std::ratio<1L,_1000L>_> dest_00;
  char *pcVar3;
  memory_buf_t *in_RCX;
  basic_string_view<char> *in_RSI;
  basic_string_view<char> *in_RDI;
  mdc_map_t *mdc_map;
  char *filename;
  duration<long,_std::ratio<1L,_1000L>_> millis;
  __enable_if_is_duration<std::chrono::duration<long>_> secs;
  duration duration;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff28;
  memory_buf_t *dest_01;
  buffer<char> *in_stack_ffffffffffffff30;
  memory_buf_t *in_stack_ffffffffffffff40;
  time_point in_stack_ffffffffffffff48;
  undefined5 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  memory_buf_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar4;
  int in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffc9;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&in_RSI[1].size_);
  this_00 = std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      (in_stack_ffffffffffffff28);
  bVar1 = std::chrono::operator==
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff40,
                     (duration<long,_std::ratio<1L,_1L>_> *)in_RDI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    sVar2 = ::fmt::v11::detail::buffer<char>::size((buffer<char> *)(in_RDI + 2));
    if (sVar2 != 0) goto LAB_005ed8b5;
  }
  ::fmt::v11::detail::buffer<char>::clear((buffer<char> *)(in_RDI + 2));
  in_stack_ffffffffffffffcf = 0x5b;
  ::fmt::v11::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  fmt_helper::append_int<int>
            (CONCAT13(in_stack_ffffffffffffff67,
                      CONCAT12(in_stack_ffffffffffffff66,
                               CONCAT11(in_stack_ffffffffffffff65,in_stack_ffffffffffffff64))),
             in_stack_ffffffffffffff58);
  in_stack_ffffffffffffffce = 0x2d;
  ::fmt::v11::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  fmt_helper::pad2(in_stack_ffffffffffffff6c,
                   (memory_buf_t *)
                   CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT15(in_stack_ffffffffffffff65,
                                              CONCAT14(in_stack_ffffffffffffff64,
                                                       in_stack_ffffffffffffff60)))));
  in_stack_ffffffffffffffcd = 0x2d;
  ::fmt::v11::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  fmt_helper::pad2(in_stack_ffffffffffffff6c,
                   (memory_buf_t *)
                   CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT15(in_stack_ffffffffffffff65,
                                              CONCAT14(in_stack_ffffffffffffff64,
                                                       in_stack_ffffffffffffff60)))));
  in_stack_ffffffffffffffcc = 0x20;
  ::fmt::v11::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  fmt_helper::pad2(in_stack_ffffffffffffff6c,
                   (memory_buf_t *)
                   CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT15(in_stack_ffffffffffffff65,
                                              CONCAT14(in_stack_ffffffffffffff64,
                                                       in_stack_ffffffffffffff60)))));
  in_stack_ffffffffffffffcb = 0x3a;
  ::fmt::v11::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  fmt_helper::pad2(in_stack_ffffffffffffff6c,
                   (memory_buf_t *)
                   CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT15(in_stack_ffffffffffffff65,
                                              CONCAT14(in_stack_ffffffffffffff64,
                                                       in_stack_ffffffffffffff60)))));
  in_stack_ffffffffffffffca = 0x3a;
  ::fmt::v11::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  fmt_helper::pad2(in_stack_ffffffffffffff6c,
                   (memory_buf_t *)
                   CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT15(in_stack_ffffffffffffff65,
                                              CONCAT14(in_stack_ffffffffffffff64,
                                                       in_stack_ffffffffffffff60)))));
  in_stack_ffffffffffffffc9 = 0x2e;
  ::fmt::v11::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  in_RDI[1].size_ = this_00.__r;
LAB_005ed8b5:
  dest_01 = in_RCX;
  this_01 = (buffer<char> *)::fmt::v11::detail::buffer<char>::begin((buffer<char> *)(in_RDI + 2));
  ::fmt::v11::detail::buffer<char>::end((buffer<char> *)(in_RDI + 2));
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT15(in_stack_ffffffffffffff65,
                                        CONCAT14(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60
                                                )))),(char *)in_stack_ffffffffffffff58,
             (char *)CONCAT17(in_stack_ffffffffffffff57,
                              CONCAT16(in_stack_ffffffffffffff56,
                                       CONCAT15(in_stack_ffffffffffffff55,in_stack_ffffffffffffff50)
                                      )));
  dest_00 = fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000l>>>
                      (in_stack_ffffffffffffff48);
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
            ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xffffffffffffffc0);
  fmt_helper::pad3<unsigned_int>((uint)((ulong)this_01 >> 0x20),dest_01);
  ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
  ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
  sVar2 = ::fmt::v11::basic_string_view<char>::size(in_RSI);
  if (sVar2 != 0) {
    ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
    view.size_._0_5_ = in_stack_ffffffffffffff50;
    view.data_ = (char *)in_stack_ffffffffffffff48.__d.__r;
    view.size_._5_1_ = in_stack_ffffffffffffff55;
    view.size_._6_1_ = in_stack_ffffffffffffff56;
    view.size_._7_1_ = in_stack_ffffffffffffff57;
    fmt_helper::append_string_view(view,in_stack_ffffffffffffff40);
    ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
    ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
  }
  ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
  sVar2 = ::fmt::v11::detail::buffer<char>::size(&in_RCX->super_buffer<char>);
  in_RSI[2].size_ = sVar2;
  spdlog::level::to_string_view(*(level_enum *)&in_RSI[1].data_);
  view_00.size_._0_5_ = in_stack_ffffffffffffff50;
  view_00.data_ = (char *)in_stack_ffffffffffffff48.__d.__r;
  view_00.size_._5_1_ = in_stack_ffffffffffffff55;
  view_00.size_._6_1_ = in_stack_ffffffffffffff56;
  view_00.size_._7_1_ = in_stack_ffffffffffffff57;
  fmt_helper::append_string_view(view_00,in_stack_ffffffffffffff40);
  pcVar3 = (char *)::fmt::v11::detail::buffer<char>::size(&in_RCX->super_buffer<char>);
  in_RSI[3].data_ = pcVar3;
  ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
  ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
  bVar1 = source_loc::empty((source_loc *)&in_RSI[3].size_);
  if (!bVar1) {
    ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
    short_filename_formatter<spdlog::details::null_scoped_padder>::basename((char *)in_RSI[3].size_)
    ;
    ::fmt::v11::basic_string_view<char>::basic_string_view(in_RDI,(char *)this_01);
    view_01.size_._0_5_ = in_stack_ffffffffffffff50;
    view_01.data_ = (char *)in_stack_ffffffffffffff48.__d.__r;
    view_01.size_._5_1_ = in_stack_ffffffffffffff55;
    view_01.size_._6_1_ = in_stack_ffffffffffffff56;
    view_01.size_._7_1_ = in_stack_ffffffffffffff57;
    fmt_helper::append_string_view(view_01,in_stack_ffffffffffffff40);
    uVar4 = 0x3a;
    ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
    fmt_helper::append_int<int>
              (CONCAT13(uVar4,CONCAT12(in_stack_ffffffffffffff66,
                                       CONCAT11(in_stack_ffffffffffffff65,in_stack_ffffffffffffff64)
                                      )),in_stack_ffffffffffffff58);
    ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
    ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
  }
  mdc::get_context_abi_cxx11_();
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x5edb9c);
  if (!bVar1) {
    in_stack_ffffffffffffff57 = 0x5b;
    ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
    mdc_formatter<spdlog::details::null_scoped_padder>::format_mdc
              ((mdc_formatter<spdlog::details::null_scoped_padder> *)this_00.__r,
               (mdc_map_t *)
               CONCAT17(in_stack_ffffffffffffffcf,
                        CONCAT16(in_stack_ffffffffffffffce,
                                 CONCAT15(in_stack_ffffffffffffffcd,
                                          CONCAT14(in_stack_ffffffffffffffcc,
                                                   CONCAT13(in_stack_ffffffffffffffcb,
                                                            CONCAT12(in_stack_ffffffffffffffca,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffc9,
                                                  in_stack_ffffffffffffffc8))))))),
               (memory_buf_t *)dest_00.__r);
    in_stack_ffffffffffffff56 = 0x5d;
    ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
    in_stack_ffffffffffffff55 = 0x20;
    ::fmt::v11::detail::buffer<char>::push_back(this_01,(char *)dest_01);
  }
  view_02.size_._0_5_ = in_stack_ffffffffffffff50;
  view_02.data_ = (char *)in_RSI[5].size_;
  view_02.size_._5_1_ = in_stack_ffffffffffffff55;
  view_02.size_._6_1_ = in_stack_ffffffffffffff56;
  view_02.size_._7_1_ = in_stack_ffffffffffffff57;
  fmt_helper::append_string_view(view_02,(memory_buf_t *)in_RSI[5].data_);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0) {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

        // append logger name if exists
        if (msg.logger_name.size() > 0) {
            dest.push_back('[');
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty()) {
            dest.push_back('[');
            const char *filename =
                details::short_filename_formatter<details::null_scoped_padder>::basename(
                    msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

#ifndef SPDLOG_NO_TLS
        // add mdc if present
        auto &mdc_map = mdc::get_context();
        if (!mdc_map.empty()) {
            dest.push_back('[');
            mdc_formatter_.format_mdc(mdc_map, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
#endif
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }